

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::SetScissorRects
          (DeviceContextVkImpl *this,Uint32 NumRects,Rect *pRects,Uint32 RTWidth,Uint32 RTHeight)

{
  PipelineStateVkImpl *this_00;
  GraphicsPipelineDesc *pGVar1;
  string msg;
  Uint32 local_40;
  Uint32 local_3c;
  string local_38;
  
  local_40 = RTHeight;
  local_3c = RTWidth;
  DeviceContextBase<Diligent::EngineVkImplTraits>::SetScissorRects
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,NumRects,pRects,&local_3c,
             &local_40);
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
  if (this_00 != (PipelineStateVkImpl *)0x0) {
    PipelineStateBase<Diligent::EngineVkImplTraits>::CheckPipelineReady
              (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if (((this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
         .m_Desc.PipelineType & ~PIPELINE_TYPE_MESH) == PIPELINE_TYPE_GRAPHICS) {
      pGVar1 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                         (&((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.
                           m_pObject)->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
      if ((pGVar1->RasterizerDesc).ScissorEnable == true) {
        if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects != NumRects) {
          FormatString<char[35]>(&local_38,(char (*) [35])"Unexpected number of scissor rects");
          DebugAssertionFailed
                    (local_38._M_dataplus._M_p,"SetScissorRects",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x6f2);
          std::__cxx11::string::~string((string *)&local_38);
        }
        CommitScissorRects(this);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetScissorRects(Uint32 NumRects, const Rect* pRects, Uint32 RTWidth, Uint32 RTHeight)
{
    TDeviceContextBase::SetScissorRects(NumRects, pRects, RTWidth, RTHeight);

    // Only commit scissor rects if scissor test is enabled in the rasterizer state.
    // If scissor is currently disabled, or no PSO is bound, scissor rects will be committed by
    // the SetPipelineState() when a PSO with enabled scissor test is set.
    if (m_pPipelineState && m_pPipelineState->GetDesc().IsAnyGraphicsPipeline() && m_pPipelineState->GetGraphicsPipelineDesc().RasterizerDesc.ScissorEnable)
    {
        VERIFY(NumRects == m_NumScissorRects, "Unexpected number of scissor rects");
        CommitScissorRects();
    }
}